

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void read_message_from_console(void)

{
  bool bVar1;
  reference piVar2;
  iterator iStack_186f8;
  int ch;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  allocator aStack_186c9;
  string asStack_186c8 [32];
  char acStack_186a8 [8];
  char message [100000];
  
  fgets(acStack_186a8,100000,_stdin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_186c8,acStack_186a8,&aStack_186c9);
  std::__cxx11::string::operator=((string *)tosend_message_abi_cxx11_,asStack_186c8);
  std::__cxx11::string::~string(asStack_186c8);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_186c9);
  fprintf(_stderr,"Input from console: %s\n",acStack_186a8);
  if ((flag_root & 1U) == 0) {
    create_new_message(1,id_parent);
  }
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&children);
  iStack_186f8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&children);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xfffffffffffe7908);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    create_new_message(1,*piVar2);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  return;
}

Assistant:

void read_message_from_console() {
    char message[MESSAGE_MAX_SIZE];
    fgets(message, MESSAGE_MAX_SIZE, stdin);
    tosend_message = std::string(message);
    fprintf(stderr, "Input from console: %s\n", message);

    if (!flag_root) {
        create_new_message(MSG, id_parent);
    }
    for (auto ch : children) {
        create_new_message(MSG, ch);
    }
}